

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

int cuddTimesInDeathRow(DdManager *dd,DdNode *f)

{
  int local_20;
  int local_1c;
  int i;
  int count;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < dd->deathRowDepth; local_20 = local_20 + 1) {
    local_1c = (uint)(f == dd->deathRow[local_20]) + local_1c;
  }
  return local_1c;
}

Assistant:

int
cuddTimesInDeathRow(
  DdManager *dd,
  DdNode *f)
{
    int count = 0;
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        count += f == dd->deathRow[i];
    }
#endif

    return(count);

}